

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# treewalker.cpp
# Opt level: O1

void __thiscall TreeWalker::acceptActionGroup(TreeWalker *this,DomActionGroup *actionGroup)

{
  QArrayData *pQVar1;
  ulong uVar2;
  DomAction **ppDVar3;
  DomActionGroup **ppDVar4;
  int i;
  ulong uVar5;
  
  uVar5 = 0;
  while( true ) {
    pQVar1 = &((actionGroup->m_action).d.d)->super_QArrayData;
    uVar2 = (actionGroup->m_action).d.size;
    if (pQVar1 != (QArrayData *)0x0) {
      LOCK();
      (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
      LOCK();
      (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar1,8,0x10);
      }
    }
    if (uVar2 <= uVar5) break;
    pQVar1 = &((actionGroup->m_action).d.d)->super_QArrayData;
    ppDVar3 = (actionGroup->m_action).d.ptr;
    if (pQVar1 == (QArrayData *)0x0) {
      (*this->_vptr_TreeWalker[0x1a])(this,ppDVar3[uVar5]);
    }
    else {
      LOCK();
      (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
      (*this->_vptr_TreeWalker[0x1a])(this,ppDVar3[uVar5]);
      LOCK();
      (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar1,8,0x10);
      }
    }
    uVar5 = uVar5 + 1;
  }
  uVar5 = 0;
  while( true ) {
    pQVar1 = &((actionGroup->m_actionGroup).d.d)->super_QArrayData;
    uVar2 = (actionGroup->m_actionGroup).d.size;
    if (pQVar1 != (QArrayData *)0x0) {
      LOCK();
      (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
      LOCK();
      (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar1,8,0x10);
      }
    }
    if (uVar2 <= uVar5) break;
    pQVar1 = &((actionGroup->m_actionGroup).d.d)->super_QArrayData;
    ppDVar4 = (actionGroup->m_actionGroup).d.ptr;
    if (pQVar1 == (QArrayData *)0x0) {
      (*this->_vptr_TreeWalker[0x1b])(this,ppDVar4[uVar5]);
    }
    else {
      LOCK();
      (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
      (*this->_vptr_TreeWalker[0x1b])(this,ppDVar4[uVar5]);
      LOCK();
      (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar1,8,0x10);
      }
    }
    uVar5 = uVar5 + 1;
  }
  return;
}

Assistant:

void TreeWalker::acceptActionGroup(DomActionGroup *actionGroup)
{
    for (int i=0; i<actionGroup->elementAction().size(); ++i)
        acceptAction(actionGroup->elementAction().at(i));

    for (int i=0; i<actionGroup->elementActionGroup().size(); ++i)
        acceptActionGroup(actionGroup->elementActionGroup().at(i));
}